

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O2

bool __thiscall CppJieba::Trie::_trieInsert(Trie *this,char *filePath)

{
  uint uVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  allocator local_2e9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vecBuf;
  string local_2c8;
  string line;
  TrieNodeInfo nodeInfo;
  ifstream ifile;
  
  std::ifstream::ifstream(&ifile,filePath,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  vecBuf.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vecBuf.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vecBuf.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nodeInfo.tag._M_dataplus._M_p = (pointer)&nodeInfo.tag.field_2;
  nodeInfo.word.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nodeInfo.freq = 0;
  nodeInfo.word.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nodeInfo.word.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nodeInfo.tag._M_string_length = 0;
  nodeInfo.tag.field_2._M_local_buf[0] = '\0';
  nodeInfo.logFreq = 0.0;
  do {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ifile,(string *)&line);
    uVar1 = *(uint *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18) + 0x20);
    if ((uVar1 & 5) != 0) {
LAB_00113734:
      TrieNodeInfo::~TrieNodeInfo(&nodeInfo);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vecBuf);
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&ifile);
      return (uVar1 & 5) != 0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&vecBuf);
    std::__cxx11::string::string((string *)&local_2c8," ",&local_2e9);
    Limonp::splitStr(&line,&vecBuf,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    if (0x60 < (ulong)((long)vecBuf.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)vecBuf.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      std::__cxx11::string::string((string *)&local_2c8,"line[%s] illegal.",&local_2e9);
      Limonp::Logger::LoggingF(3,"Trie.hpp",0x148,&local_2c8,line._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_2c8);
      goto LAB_00113734;
    }
    bVar3 = Limonp::utf8ToUnicode
                      (vecBuf.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,&nodeInfo.word);
    pbVar2 = vecBuf.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (!bVar3) goto LAB_00113734;
    iVar4 = atoi(vecBuf.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    nodeInfo.freq = (size_t)iVar4;
    if ((long)vecBuf.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 == 0x60) {
      std::__cxx11::string::_M_assign((string *)&nodeInfo.tag);
    }
    bVar3 = _insert(this,&nodeInfo);
    if (!bVar3) {
      std::__cxx11::string::string((string *)&local_2c8,"_insert node failed!",&local_2e9);
      Limonp::Logger::LoggingF(3,"Trie.hpp",0x158,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
    }
  } while( true );
}

Assistant:

bool _trieInsert(const char * const filePath)
            {
                ifstream ifile(filePath);
                string line;
                vector<string> vecBuf;

                TrieNodeInfo nodeInfo;
                while(getline(ifile, line))
                {
                    vecBuf.clear();
                    splitStr(line, vecBuf, " ");
                    if(3 < vecBuf.size())
                    {
                        LogError("line[%s] illegal.", line.c_str());
                        return false;
                    }
                    if(!TransCode::decode(vecBuf[0], nodeInfo.word))
                    {
                        return false;
                    }
                    nodeInfo.freq = atoi(vecBuf[1].c_str());
                    if(3 == vecBuf.size())
                    {
                        nodeInfo.tag = vecBuf[2];
                    }

                    //_insert node
                    if(!_insert(nodeInfo))
                    {
                        LogError("_insert node failed!");
                    }
                }
                return true;
            }